

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void ParseStructMember(CStructure *st)

{
  char cVar1;
  int noffset;
  aint len_00;
  bool bVar2;
  EStructureMembers EVar3;
  int iVar4;
  uint uVar5;
  char *naam;
  CStructure *st_00;
  byte *data;
  CStructureEntry2 *pCVar6;
  ulong __n;
  EType EVar7;
  uint local_840;
  aint len;
  char *pp;
  char *structName;
  char warnTxt [2048];
  
  bp = lp;
  Relocation::isResultAffected = '\0';
  EVar3 = GetStructMemberId(&lp);
  switch(EVar3) {
  case SMEMBALIGN:
    ParseAlignArguments(&lp,(aint *)warnTxt,(aint *)&pp);
    iVar4 = 4;
    if (warnTxt._0_4_ != -1) {
      iVar4 = warnTxt._0_4_;
    }
    if (st->maxAlignment < iVar4) {
      st->maxAlignment = iVar4;
    }
    noffset = st->noffset;
    uVar5 = iVar4 - 1U & -noffset;
    if ((int)uVar5 < 1) goto LAB_0011ee74;
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,noffset,uVar5,(aint)pp,OFF,SMEMBBLOCK);
    break;
  case SMEMBBYTE:
    uVar5 = ParseExpression(&lp,(aint *)&local_840);
    if (uVar5 != 0) {
      uVar5 = local_840;
    }
    check8(uVar5);
    EVar7 = OFF;
    if (Relocation::isResultAffected != '\0') {
      EVar7 = Relocation::deltaType;
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,1,uVar5,EVar7,SMEMBBYTE);
    CStructure::AddMember(st,pCVar6);
    EVar7 = HIGH;
    goto LAB_0011ece6;
  case SMEMBWORD:
    uVar5 = ParseExpression(&lp,(aint *)&local_840);
    if (uVar5 != 0) {
      uVar5 = local_840;
    }
    check16(uVar5);
    EVar7 = OFF;
    if (Relocation::isResultAffected != '\0') {
      EVar7 = Relocation::deltaType;
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,2,uVar5,EVar7,SMEMBWORD);
    CStructure::AddMember(st,pCVar6);
    EVar7 = REGULAR;
LAB_0011ece6:
    Relocation::resolveRelocationAffected(0x7fffffff,EVar7);
    goto LAB_0011ee74;
  case SMEMBBLOCK:
    iVar4 = ParseExpression(&lp,&len);
    if (iVar4 == 0) {
      len = 1;
      Error("[STRUCT] Expression expected",(char *)0x0,PASS3);
    }
    bVar2 = comma(&lp);
    if (bVar2) {
      iVar4 = ParseExpression(&lp,(aint *)&local_840);
      uVar5 = local_840;
      if (iVar4 == 0) {
        Error("[STRUCT] Expression expected",(char *)0x0,PASS3);
        uVar5 = 0;
      }
      check8(uVar5);
      uVar5 = uVar5 & 0xff;
    }
    else {
      uVar5 = 0xffffffff;
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,len,uVar5,OFF,SMEMBBLOCK);
    break;
  case SMEMBDWORD:
    uVar5 = ParseExpression(&lp,(aint *)&local_840);
    if (uVar5 != 0) {
      uVar5 = local_840;
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,4,uVar5,OFF,SMEMBDWORD);
    break;
  case SMEMBD24:
    uVar5 = ParseExpression(&lp,(aint *)&local_840);
    if (uVar5 != 0) {
      uVar5 = local_840;
    }
    check24(uVar5);
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,3,uVar5,OFF,SMEMBD24);
    break;
  case SMEMBTEXT:
    iVar4 = ParseExpression(&lp,&len);
    len_00 = len;
    if (len - 0x2001U < 0xffffe000 || iVar4 == 0) {
      Error("[STRUCT] Expression for length of text expected (1..8192)",(char *)0x0,PASS3);
      SkipToEol(&lp);
      goto LAB_0011ee74;
    }
    __n = (ulong)(uint)len;
    data = (byte *)operator_new__(__n);
    memset(data,0,__n);
    bVar2 = comma(&lp);
    if (bVar2) {
      GetStructText(&lp,len_00,data,(byte *)0x0);
    }
    else {
      iVar4 = SkipBlanks(&lp);
      if (iVar4 == 0) {
        Error("[STRUCT] Comma expected",lp,SUPPRESS);
      }
    }
    pCVar6 = (CStructureEntry2 *)operator_new(0x28);
    CStructureEntry2::CStructureEntry2(pCVar6,st->noffset,len_00,data);
    break;
  default:
    pp = lp;
    SkipBlanks(&pp);
    cVar1 = *pp;
    if (cVar1 == '@') {
      pp = pp + 1;
    }
    naam = GetID(&pp);
    if ((naam != (char *)0x0) &&
       (st_00 = CStructureTable::zoek(&StructureTable,naam,(uint)(cVar1 == '@')),
       st_00 != (CStructure *)0x0)) {
      structName = st->naam;
      iVar4 = cmphstr(&structName,naam,false);
      if (iVar4 == 0) {
        if ((st_00->maxAlignment != 0) && ((st_00->maxAlignment - 1U & -st->noffset) != 0)) {
          snprintf(warnTxt,0x800,
                   "Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes"
                   ,st_00->naam);
          Warning(warnTxt,(char *)0x0,W_PASS3);
        }
        lp = pp;
        CStructure::CopyLabels(st,st_00);
        CStructure::CopyMembers(st,st_00,&lp);
      }
      else {
        Error("[STRUCT] Can\'t include itself",(char *)0x0,PASS3);
        SkipToEol(&pp);
        lp = pp;
      }
    }
    goto LAB_0011ee74;
  }
  CStructure::AddMember(st,pCVar6);
LAB_0011ee74:
  Relocation::checkAndWarn(false);
  return;
}

Assistant:

void ParseStructMember(CStructure* st) {
	aint val, len;
	bp = lp;
	Relocation::isResultAffected = false;
	Relocation::EType deltaType = Relocation::OFF;
	switch (GetStructMemberId(lp)) {
	case SMEMBBLOCK:
		if (!ParseExpression(lp, len)) {
			len = 1;
			Error("[STRUCT] Expression expected");
		}
		if (comma(lp)) {
			if (!ParseExpression(lp, val)) {
				val = 0;
				Error("[STRUCT] Expression expected");
			}
			check8(val);
			val &= 255;
		} else {
			val = -1;
		}
		st->AddMember(new CStructureEntry2(st->noffset, len, val, deltaType, SMEMBBLOCK));
		break;
	case SMEMBBYTE:
		if (!ParseExpression(lp, val)) val = 0;
		check8(val);
		deltaType = Relocation::isResultAffected ? Relocation::deltaType : Relocation::OFF;
		st->AddMember(new CStructureEntry2(st->noffset, 1, val, deltaType, SMEMBBYTE));
		Relocation::resolveRelocationAffected(INT_MAX, Relocation::HIGH);	// clear flags + warn when can't be relocated
		break;
	case SMEMBWORD:
		if (!ParseExpression(lp, val)) val = 0;
		check16(val);
		deltaType = Relocation::isResultAffected ? Relocation::deltaType : Relocation::OFF;
		st->AddMember(new CStructureEntry2(st->noffset, 2, val, deltaType, SMEMBWORD));
		Relocation::resolveRelocationAffected(INT_MAX);	// clear flags + warn when can't be relocated
		break;
	case SMEMBD24:
		if (!ParseExpression(lp, val)) val = 0;
		check24(val);
		st->AddMember(new CStructureEntry2(st->noffset, 3, val, deltaType, SMEMBD24));
		break;
	case SMEMBDWORD:
		if (!ParseExpression(lp, val)) val = 0;
		st->AddMember(new CStructureEntry2(st->noffset, 4, val, deltaType, SMEMBDWORD));
		break;
	case SMEMBTEXT:
		{
			if (!ParseExpression(lp, len) || len < 1 || CStructureEntry2::TEXT_MAX_SIZE < len) {
				Error("[STRUCT] Expression for length of text expected (1..8192)");
				SkipToEol(lp);
				break;
			}
			byte* textData = new byte[len]();	// zero-initialized for stable binary results
			if (nullptr == textData) ErrorOOM();
			if (comma(lp)) {		// if comma then init data array explicitly
				GetStructText(lp, len, textData);
			} else if (SkipBlanks(lp)) {
				// if empty without comma, init with the zeroed values
			} else {
				Error("[STRUCT] Comma expected", lp, SUPPRESS);	// syntax error
			}
			st->AddMember(new CStructureEntry2(st->noffset, len, textData));
		}
		break;
	case SMEMBALIGN:
	{
		aint val, fill;
		ParseAlignArguments(lp, val, fill);
		if (-1 == val) val = 4;
		if (st->maxAlignment < val) st->maxAlignment = val;	// update structure "max alignment"
		aint bytesToAdvance = (~st->noffset + 1) & (val - 1);
		if (bytesToAdvance < 1) break;		// already aligned, nothing to do
		// create alignment block
		st->AddMember(new CStructureEntry2(st->noffset, bytesToAdvance, fill, deltaType, SMEMBBLOCK));
		break;
	}
	default:
		char* pp = lp,* n;
		int gl = 0;
		CStructure* s;
		SkipBlanks(pp);
		if (*pp == '@') {
			++pp;
			gl = 1;
		}
		if ((n = GetID(pp)) && (s = StructureTable.zoek(n, gl))) {
			char* structName = st->naam;	// need copy of pointer so cmphstr can advance it in case of match
			if (cmphstr(structName, n)) {
				Error("[STRUCT] Can't include itself", NULL);
				SkipToEol(pp);
				lp = pp;
				break;
			}
			if (s->maxAlignment && ((~st->noffset + 1) & (s->maxAlignment - 1))) {
				// Inserted structure did use ALIGN in definition and it is misaligned here
				char warnTxt[LINEMAX];
				SPRINTF3(warnTxt, LINEMAX,
						 "Struct %s did use ALIGN %d in definition, but here it is misaligned by %d bytes",
						 s->naam, s->maxAlignment, ((~st->noffset + 1) & (s->maxAlignment - 1)));
				Warning(warnTxt);
			}
			lp = pp;
			st->CopyLabels(s);
			st->CopyMembers(s, lp);
		}
		break;
	}
	Relocation::checkAndWarn();
}